

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memtable.cc
# Opt level: O2

Iterator * __thiscall leveldb::MemTable::NewIterator(MemTable *this)

{
  MemTableIterator *this_00;
  
  this_00 = (MemTableIterator *)operator_new(0x58);
  MemTableIterator::MemTableIterator(this_00,&this->table_);
  return &this_00->super_Iterator;
}

Assistant:

Iterator *MemTable::NewIterator() {
        return new MemTableIterator(&table_);
    }